

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::peer_error_alert::peer_error_alert
          (peer_error_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,
          peer_id *peer_id,operation_t op_,error_code *e)

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  string local_58;
  operation_t local_31;
  peer_id *ppStack_30;
  operation_t op__local;
  peer_id *peer_id_local;
  endpoint *ep_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  peer_error_alert *this_local;
  
  local_31 = op_;
  ppStack_30 = peer_id;
  peer_id_local = (peer_id *)ep;
  ep_local = (endpoint *)h;
  h_local = (torrent_handle *)alloc;
  alloc_local = (stack_allocator *)this;
  peer_alert::peer_alert(&this->super_peer_alert,alloc,h,ep,peer_id);
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__peer_error_alert_00991958;
  (this->super_peer_alert).field_0x9c = local_31;
  bVar2 = e->failed_;
  uVar3 = *(undefined3 *)&e->field_0x5;
  peVar1 = e->cat_;
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  this->operation = (uint)local_31;
  boost::system::error_code::message_abi_cxx11_(&local_58,&this->error);
  convert_from_native(&this->msg,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

peer_error_alert::peer_error_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, tcp::endpoint const& ep, peer_id const& peer_id, operation_t const op_
		, error_code const& e)
		: peer_alert(alloc, h, ep, peer_id)
		, op(op_)
		, error(e)
#if TORRENT_ABI_VERSION == 1
		, operation(static_cast<int>(op_))
		, msg(convert_from_native(error.message()))
#endif
	{}